

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O0

pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
* __thiscall
AddrManImpl::Select_
          (AddrManImpl *this,bool new_only,
          unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
          *networks)

{
  long lVar1;
  string_view source_file;
  string_view logging_function;
  bool bVar2;
  undefined4 uVar3;
  char *pcVar4;
  pointer pvVar5;
  nid_type nVar6;
  bool *pbVar7;
  pointer pvVar8;
  uint64_t uVar9;
  size_t in_RCX;
  byte in_DL;
  long in_RSI;
  pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  NodeSeconds now;
  double dVar10;
  undefined1 auVar11 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  char **in_stack_00000008;
  AddrInfo *info;
  int position;
  int i;
  int initial_position;
  int bucket;
  double chance_factor;
  int bucket_count;
  bool search_tried;
  value_type *network;
  unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
  *__range2;
  size_t tried_count;
  size_t new_count;
  const_iterator it_found;
  const_iterator it_1;
  nid_type node_id;
  NewTriedCount counts;
  const_iterator it;
  const_iterator __end2;
  const_iterator __begin2;
  undefined4 in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  char *in_stack_fffffffffffffe50;
  pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  *in_stack_fffffffffffffe58;
  char *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  undefined7 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe77;
  AddrManImpl *in_stack_fffffffffffffe78;
  CService *this_00;
  bool local_159;
  int source_line;
  int local_114;
  char *pcVar12;
  ConstevalFormatString<2U> fmt;
  uint in_stack_ffffffffffffff04;
  reference in_stack_ffffffffffffff08;
  size_t in_stack_ffffffffffffff10;
  long local_e0;
  Level in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::mutex>>
            ((char *)in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,
             (AnnotatedMixin<std::mutex> *)0xee6531);
  bVar2 = std::vector<long,_std::allocator<long>_>::empty
                    ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffe58);
  if (bVar2) {
    std::
    pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::
    pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>,_true>
              ((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  }
  else {
    local_e0 = (long)*(int *)(in_RSI + 0x20178);
    pcVar4 = (char *)(long)*(int *)(in_RSI + 0x170);
    bVar2 = std::
            unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
            ::empty((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                     *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    if (!bVar2) {
      local_e0 = 0;
      pcVar4 = (char *)0x0;
      std::
      unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
      begin((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
             *)in_stack_fffffffffffffe50);
      std::
      unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>::
      end((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
           *)in_stack_fffffffffffffe50);
      while (bVar2 = std::__detail::operator==
                               ((_Node_iterator_base<Network,_false> *)in_stack_fffffffffffffe58,
                                (_Node_iterator_base<Network,_false> *)in_stack_fffffffffffffe50),
            in_stack_ffffffffffffff10 = in_RCX, ((bVar2 ^ 0xffU) & 1) != 0) {
        in_stack_ffffffffffffff08 =
             std::__detail::_Node_const_iterator<Network,_true,_false>::operator*
                       ((_Node_const_iterator<Network,_true,_false> *)
                        CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        std::
        unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
        ::find((unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
                *)in_stack_fffffffffffffe50,
               (key_type *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        std::
        unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
        ::end((unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
               *)in_stack_fffffffffffffe50);
        bVar2 = std::__detail::operator==
                          ((_Node_iterator_base<std::pair<const_Network,_AddrManImpl::NewTriedCount>,_false>
                            *)in_stack_fffffffffffffe58,
                           (_Node_iterator_base<std::pair<const_Network,_AddrManImpl::NewTriedCount>,_false>
                            *)in_stack_fffffffffffffe50);
        if (!bVar2) {
          pvVar5 = std::__detail::
                   _Node_const_iterator<std::pair<const_Network,_AddrManImpl::NewTriedCount>,_false,_false>
                   ::operator->((_Node_const_iterator<std::pair<const_Network,_AddrManImpl::NewTriedCount>,_false,_false>
                                 *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
          local_e0 = (pvVar5->second).n_new + local_e0;
          pcVar4 = pcVar4 + (pvVar5->second).n_tried;
        }
        std::__detail::_Node_const_iterator<Network,_true,_false>::operator++
                  ((_Node_const_iterator<Network,_true,_false> *)
                   CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      }
    }
    if (((in_DL & 1) == 0) || (local_e0 != 0)) {
      if (pcVar4 + local_e0 == (char *)0x0) {
        std::
        pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
        ::
        pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>,_true>
                  ((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      }
      else {
        if (((in_DL & 1) == 0) && (pcVar4 != (char *)0x0)) {
          if (local_e0 == 0) {
            in_stack_ffffffffffffff04 = CONCAT13(1,(int3)in_stack_ffffffffffffff04);
          }
          else {
            bVar2 = RandomMixin<FastRandomContext>::randbool
                              ((RandomMixin<FastRandomContext> *)
                               CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
            in_stack_ffffffffffffff04 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff04);
          }
        }
        else {
          in_stack_ffffffffffffff04 = in_stack_ffffffffffffff04 & 0xffffff;
        }
        uVar3 = 0x400;
        if ((char)(in_stack_ffffffffffffff04 >> 0x18) != '\0') {
          uVar3 = 0x100;
        }
        pcVar12 = (char *)0x3ff0000000000000;
LAB_00ee679b:
        do {
          RandomMixin<FastRandomContext>::randrange<int>
                    ((RandomMixin<FastRandomContext> *)
                     CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                     in_stack_fffffffffffffe6c);
          RandomMixin<FastRandomContext>::randrange<int>
                    ((RandomMixin<FastRandomContext> *)
                     CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                     in_stack_fffffffffffffe6c);
          for (local_114 = 0; local_114 < 0x40; local_114 = local_114 + 1) {
            nVar6 = GetEntry(in_stack_fffffffffffffe78,(bool)in_stack_fffffffffffffe77,
                             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                             (size_t)in_stack_fffffffffffffe60);
            if (nVar6 != -1) {
              bVar2 = std::
                      unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                      ::empty((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                               *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
              if (bVar2) break;
              std::
              unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
              ::find((unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
                      *)in_stack_fffffffffffffe50,
                     (key_type *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
              std::
              unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
              ::end((unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
                     *)in_stack_fffffffffffffe50);
              std::__detail::operator==
                        ((_Node_iterator_base<std::pair<const_long,_AddrInfo>,_false> *)
                         in_stack_fffffffffffffe58,
                         (_Node_iterator_base<std::pair<const_long,_AddrInfo>,_false> *)
                         in_stack_fffffffffffffe50);
              pbVar7 = inline_assertion_check<false,bool>
                                 ((bool *)CONCAT44(in_stack_fffffffffffffe6c,
                                                   in_stack_fffffffffffffe68),
                                  in_stack_fffffffffffffe60,
                                  (int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                                  in_stack_fffffffffffffe50,
                                  (char *)CONCAT44(in_stack_fffffffffffffe4c,
                                                   in_stack_fffffffffffffe48));
              local_159 = false;
              if ((*pbVar7 & 1U) != 0) {
                std::__detail::_Node_const_iterator<std::pair<const_long,_AddrInfo>,_false,_false>::
                operator->((_Node_const_iterator<std::pair<const_long,_AddrInfo>,_false,_false> *)
                           CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
                CNetAddr::GetNetwork((CNetAddr *)in_stack_fffffffffffffe50);
                local_159 = std::
                            unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                            ::contains((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                                        *)in_stack_fffffffffffffe58,
                                       (key_type *)in_stack_fffffffffffffe50);
              }
              if (local_159 != false) break;
            }
          }
        } while (local_114 == 0x40);
        std::
        unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
        ::find((unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
                *)in_stack_fffffffffffffe50,
               (key_type *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        std::
        unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
        ::end((unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
               *)in_stack_fffffffffffffe50);
        bVar2 = std::__detail::operator==
                          ((_Node_iterator_base<std::pair<const_long,_AddrInfo>,_false> *)
                           in_stack_fffffffffffffe58,
                           (_Node_iterator_base<std::pair<const_long,_AddrInfo>,_false> *)
                           in_stack_fffffffffffffe50);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          __assert_fail("it_found != mapInfo.end()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
                        ,0x30d,
                        "std::pair<CAddress, NodeSeconds> AddrManImpl::Select_(bool, const std::unordered_set<Network> &) const"
                       );
        }
        pvVar8 = std::__detail::_Node_const_iterator<std::pair<const_long,_AddrInfo>,_false,_false>
                 ::operator->((_Node_const_iterator<std::pair<const_long,_AddrInfo>,_false,_false> *
                              )CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        this_00 = (CService *)&pvVar8->second;
        uVar9 = RandomMixin<FastRandomContext>::randbits<30>
                          ((RandomMixin<FastRandomContext> *)
                           CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        auVar11._8_4_ = (int)(uVar9 >> 0x20);
        auVar11._0_8_ = uVar9;
        auVar11._12_4_ = 0x45300000;
        now.__d.__r = (duration)
                      ((auVar11._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0));
        fmt.fmt = pcVar12;
        Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
        dVar10 = AddrInfo::GetChance((AddrInfo *)
                                     CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                                     now);
        source_line = (int)((ulong)in_RSI >> 0x20);
        if ((double)pcVar12 * dVar10 * 1073741824.0 <= (double)now.__d.__r) {
          pcVar12 = (char *)(fmt.fmt * 1.2);
          goto LAB_00ee679b;
        }
        bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                                    Trace);
        if (bVar2) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                     in_stack_fffffffffffffe60);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                     in_stack_fffffffffffffe60);
          in_stack_fffffffffffffe58 =
               (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                *)&stack0xffffffffffffffd8;
          CService::ToStringAddrPort_abi_cxx11_(this_00);
          in_stack_fffffffffffffe50 = "Selected %s from %s\n";
          in_stack_fffffffffffffe48 = 1;
          logging_function._M_str = pcVar4;
          logging_function._M_len = in_stack_ffffffffffffff10;
          source_file._M_len._4_4_ = in_stack_ffffffffffffff04;
          source_file._M_len._0_4_ = uVar3;
          source_file._M_str = (char *)in_stack_ffffffffffffff08;
          LogPrintFormatInternal<std::__cxx11::string,char_const*>
                    (logging_function,source_file,source_line,(LogFlags)in_RDI,
                     in_stack_fffffffffffffff0,fmt,unaff_retaddr,in_stack_00000008);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        }
        std::
        pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
        ::pair<const_AddrInfo_&,_true>
                  (in_stack_fffffffffffffe58,(AddrInfo *)in_stack_fffffffffffffe50,
                   (time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                   CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      }
    }
    else {
      std::
      pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
      ::
      pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>,_true>
                ((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::pair<CAddress, NodeSeconds> AddrManImpl::Select_(bool new_only, const std::unordered_set<Network>& networks) const
{
    AssertLockHeld(cs);

    if (vRandom.empty()) return {};

    size_t new_count = nNew;
    size_t tried_count = nTried;

    if (!networks.empty()) {
        new_count = 0;
        tried_count = 0;
        for (auto& network : networks) {
            auto it = m_network_counts.find(network);
            if (it == m_network_counts.end()) {
                continue;
            }
            auto counts = it->second;
            new_count += counts.n_new;
            tried_count += counts.n_tried;
        }
    }

    if (new_only && new_count == 0) return {};
    if (new_count + tried_count == 0) return {};

    // Decide if we are going to search the new or tried table
    // If either option is viable, use a 50% chance to choose
    bool search_tried;
    if (new_only || tried_count == 0) {
        search_tried = false;
    } else if (new_count == 0) {
        search_tried = true;
    } else {
        search_tried = insecure_rand.randbool();
    }

    const int bucket_count{search_tried ? ADDRMAN_TRIED_BUCKET_COUNT : ADDRMAN_NEW_BUCKET_COUNT};

    // Loop through the addrman table until we find an appropriate entry
    double chance_factor = 1.0;
    while (1) {
        // Pick a bucket, and an initial position in that bucket.
        int bucket = insecure_rand.randrange(bucket_count);
        int initial_position = insecure_rand.randrange(ADDRMAN_BUCKET_SIZE);

        // Iterate over the positions of that bucket, starting at the initial one,
        // and looping around.
        int i, position;
        nid_type node_id;
        for (i = 0; i < ADDRMAN_BUCKET_SIZE; ++i) {
            position = (initial_position + i) % ADDRMAN_BUCKET_SIZE;
            node_id = GetEntry(search_tried, bucket, position);
            if (node_id != -1) {
                if (!networks.empty()) {
                    const auto it{mapInfo.find(node_id)};
                    if (Assume(it != mapInfo.end()) && networks.contains(it->second.GetNetwork())) break;
                } else {
                    break;
                }
            }
        }

        // If the bucket is entirely empty, start over with a (likely) different one.
        if (i == ADDRMAN_BUCKET_SIZE) continue;

        // Find the entry to return.
        const auto it_found{mapInfo.find(node_id)};
        assert(it_found != mapInfo.end());
        const AddrInfo& info{it_found->second};

        // With probability GetChance() * chance_factor, return the entry.
        if (insecure_rand.randbits<30>() < chance_factor * info.GetChance() * (1 << 30)) {
            LogDebug(BCLog::ADDRMAN, "Selected %s from %s\n", info.ToStringAddrPort(), search_tried ? "tried" : "new");
            return {info, info.m_last_try};
        }

        // Otherwise start over with a (likely) different bucket, and increased chance factor.
        chance_factor *= 1.2;
    }
}